

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_variant.cc
# Opt level: O2

void __thiscall
VariantMoveTest_move_ctor_C_not_created_Test::~VariantMoveTest_move_ctor_C_not_created_Test
          (VariantMoveTest_move_ctor_C_not_created_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(VariantMoveTest, move_ctor_C_not_created) {
    Variant<A, B, C> v1{};

    EXPECT_EQ(ctor_count, 0);
    EXPECT_EQ(move_ctor_count, 0);
    EXPECT_EQ(dtor_count, 0);

    auto v2 = std::move(v1);

    EXPECT_EQ(ctor_count, 0);
    EXPECT_EQ(move_ctor_count, 0);
    EXPECT_EQ(dtor_count, 0);
}